

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O2

void __thiscall
Centaurus::Grammar<wchar_t>::print_dfa
          (Grammar<wchar_t> *this,wostream *os,ATNPath *path,bool optimize_flag)

{
  ATNNode<wchar_t> *pAVar1;
  SimpleException *this_00;
  allocator local_41;
  DFA<wchar_t> dfa;
  
  pAVar1 = resolve(this,path);
  if (pAVar1->m_type == RegularTerminal) {
    DFA<wchar_t>::DFA(&dfa,&pAVar1->m_nfa,optimize_flag);
    DFA<wchar_t>::print(&dfa,os,&(path->
                                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                 ).
                                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.m_id);
    NFABase<Centaurus::DFAState<wchar_t>_>::~NFABase
              (&dfa.super_NFABase<Centaurus::DFAState<wchar_t>_>);
    return;
  }
  this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&dfa,"The specified node is not an NFA.",&local_41);
  SimpleException::SimpleException(this_00,(string *)&dfa);
  __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
}

Assistant:

virtual void print_dfa(std::wostream& os, const ATNPath& path, bool optimize_flag) const override
    {
        const ATNNode<TCHAR>& node = resolve(path);

        if (node.type() != ATNNodeType::RegularTerminal)
        {
            throw SimpleException("The specified node is not an NFA.");
        }
        else
        {
            const NFA<TCHAR>& nfa = node.get_nfa();

            DFA<TCHAR> dfa(nfa, optimize_flag);

            dfa.print(os, path.leaf_id().str());
        }
    }